

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::TraverseSchema::processSubstitutionGroup
          (TraverseSchema *this,DOMElement *elem,SchemaElementDecl *elemDecl,
          ComplexTypeInfo **typeInfo,DatatypeValidator **validator,XMLCh *subsElemQName)

{
  uint namespaceURI;
  DatatypeValidator *pDVar1;
  QName *pQVar2;
  XMLCh *key1;
  GrammarResolver *this_00;
  RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
  *this_01;
  MemoryManager *pMVar3;
  BaseRefVectorOf<xercesc_4_0::SchemaInfo> *this_02;
  ulong uVar4;
  XMLSize_t XVar5;
  ulong uVar6;
  bool bVar7;
  int iVar8;
  SchemaElementDecl *subsElemDecl;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *pVVar9;
  undefined4 extraout_var;
  Grammar *pGVar10;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *pVVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  SchemaInfo *pSVar12;
  SchemaElementDecl *pSVar13;
  XMLSize_t XVar14;
  ulong uVar15;
  NamespaceScopeManager nsMgr;
  NamespaceScopeManager local_40;
  
  pSVar12 = this->fSchemaInfo;
  if (elem == (DOMElement *)0x0) {
    local_40.fScopeAdded = false;
  }
  else {
    local_40.fScopeAdded = retrieveNamespaceMapping(this,elem);
  }
  local_40.fSchemaInfo = pSVar12;
  subsElemDecl = getGlobalElemDecl(this,elem,subsElemQName);
  if (subsElemDecl == (SchemaElementDecl *)0x0) goto LAB_00338921;
  pSVar13 = subsElemDecl;
  if (subsElemDecl != elemDecl) {
    do {
      pSVar13 = pSVar13->fSubstitutionGroupElem;
      if (pSVar13 == elemDecl) break;
    } while (pSVar13 != (SchemaElementDecl *)0x0);
    if (pSVar13 == (SchemaElementDecl *)0x0) {
      bVar7 = isSubstitutionGroupValid
                        (this,elem,subsElemDecl,*typeInfo,*validator,
                         ((elemDecl->super_XMLElementDecl).fElementName)->fLocalPart,true);
      if (!bVar7) goto LAB_00338921;
      elemDecl->fSubstitutionGroupElem = subsElemDecl;
      if (*validator == (DatatypeValidator *)0x0 && *typeInfo == (ComplexTypeInfo *)0x0) {
        *typeInfo = subsElemDecl->fComplexTypeInfo;
        pDVar1 = subsElemDecl->fDatatypeValidator;
        *validator = pDVar1;
        if (pDVar1 == (DatatypeValidator *)0x0) {
          if (*typeInfo == (ComplexTypeInfo *)0x0) goto LAB_003389bd;
          elemDecl->fComplexTypeInfo = *typeInfo;
          iVar8 = (*typeInfo)->fContentType;
        }
        else {
          elemDecl->fDatatypeValidator = pDVar1;
          iVar8 = 5;
        }
        *(int *)&(elemDecl->super_XMLElementDecl).field_0x2c = iVar8;
      }
LAB_003389bd:
      pQVar2 = (subsElemDecl->super_XMLElementDecl).fElementName;
      key1 = pQVar2->fLocalPart;
      namespaceURI = pQVar2->fURIId;
      pVVar9 = RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
               ::get(this->fValidSubstitutionGroups,key1,namespaceURI);
      if (pVVar9 != (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0) goto LAB_00338afd;
      if (this->fTargetNSURI == namespaceURI) {
LAB_00338afa:
        pVVar9 = (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0;
      }
      else {
        this_00 = this->fGrammarResolver;
        iVar8 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[10])
                          (this->fURIStringPool,(ulong)namespaceURI);
        pGVar10 = GrammarResolver::getGrammar(this_00,(XMLCh *)CONCAT44(extraout_var,iVar8));
        if (pGVar10 == (Grammar *)0x0) goto LAB_00338afa;
        pVVar11 = RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                  ::get((RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                         *)pGVar10[10].super_XSerializable._vptr_XSerializable,key1,namespaceURI);
        if (pVVar11 == (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0) {
          bVar7 = SchemaInfo::circularImportExist(this->fSchemaInfo,namespaceURI);
          if (!bVar7) goto LAB_00338afa;
          this_01 = (RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                     *)pGVar10[10].super_XSerializable._vptr_XSerializable;
          pVVar11 = (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)
                    XMemory::operator_new(0x28,this->fGrammarPoolMemoryManager);
          pMVar3 = this->fGrammarPoolMemoryManager;
          pVVar11->fCallDestructor = false;
          pVVar11->fCurCount = 0;
          pVVar11->fMaxCount = 8;
          pVVar11->fElemList = (SchemaElementDecl **)0x0;
          pVVar11->fMemoryManager = pMVar3;
          iVar8 = (*pMVar3->_vptr_MemoryManager[3])();
          pVVar11->fElemList = (SchemaElementDecl **)CONCAT44(extraout_var_00,iVar8);
          pVVar9 = (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0;
          memset((SchemaElementDecl **)CONCAT44(extraout_var_00,iVar8),0,pVVar11->fMaxCount << 3);
          RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
          ::put(this_01,key1,namespaceURI,pVVar11);
        }
        else {
          pVVar9 = (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)
                   XMemory::operator_new(0x28,this->fGrammarPoolMemoryManager);
          ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::ValueVectorOf(pVVar9,pVVar11);
          RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
          ::put(this->fValidSubstitutionGroups,key1,namespaceURI,pVVar9);
        }
      }
LAB_00338afd:
      if (pVVar9 == (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0) {
        pVVar9 = (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)
                 XMemory::operator_new(0x28,this->fGrammarPoolMemoryManager);
        pMVar3 = this->fGrammarPoolMemoryManager;
        pVVar9->fCallDestructor = false;
        pVVar9->fCurCount = 0;
        pVVar9->fMaxCount = 8;
        pVVar9->fElemList = (SchemaElementDecl **)0x0;
        pVVar9->fMemoryManager = pMVar3;
        iVar8 = (*pMVar3->_vptr_MemoryManager[3])();
        pVVar9->fElemList = (SchemaElementDecl **)CONCAT44(extraout_var_01,iVar8);
        memset((SchemaElementDecl **)CONCAT44(extraout_var_01,iVar8),0,pVVar9->fMaxCount << 3);
        RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
        ::put(this->fValidSubstitutionGroups,key1,namespaceURI,pVVar9);
      }
      ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::ensureExtraCapacity(pVVar9,1);
      XVar14 = pVVar9->fCurCount;
      pVVar9->fCurCount = XVar14 + 1;
      pVVar9->fElemList[XVar14] = elemDecl;
      this_02 = &this->fSchemaInfo->fImportingInfoList->
                 super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>;
      if (this_02->fCurCount != 0) {
        XVar14 = 0;
        do {
          pSVar12 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt(this_02,XVar14);
          pGVar10 = GrammarResolver::getGrammar(this->fGrammarResolver,pSVar12->fTargetNSURIString);
          pVVar9 = RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                   ::get((RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                          *)pGVar10[10].super_XSerializable._vptr_XSerializable,key1,namespaceURI);
          if (pVVar9 != (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0) {
            uVar4 = pVVar9->fCurCount;
            bVar7 = uVar4 != 0;
            if (bVar7) {
              if (*pVVar9->fElemList == elemDecl) goto LAB_00338c35;
              uVar6 = 1;
              do {
                uVar15 = uVar6;
                if (uVar4 == uVar15) break;
                uVar6 = uVar15 + 1;
              } while (pVVar9->fElemList[uVar15] != elemDecl);
              bVar7 = uVar15 < uVar4;
            }
            if (!bVar7) {
              ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::ensureExtraCapacity(pVVar9,1);
              XVar5 = pVVar9->fCurCount;
              pVVar9->fCurCount = XVar5 + 1;
              pVVar9->fElemList[XVar5] = elemDecl;
            }
          }
LAB_00338c35:
          XVar14 = XVar14 + 1;
        } while (XVar14 < this_02->fCurCount);
      }
      buildValidSubstitutionListB(this,elem,elemDecl,subsElemDecl);
      buildValidSubstitutionListF(this,elem,elemDecl,subsElemDecl);
      goto LAB_00338921;
    }
  }
  reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x93,
                    ((elemDecl->super_XMLElementDecl).fElementName)->fLocalPart,(XMLCh *)0x0,
                    (XMLCh *)0x0,(XMLCh *)0x0);
LAB_00338921:
  NamespaceScopeManager::~NamespaceScopeManager(&local_40);
  return;
}

Assistant:

void TraverseSchema::processSubstitutionGroup(const DOMElement* const elem,
                                              SchemaElementDecl* const elemDecl,
                                              ComplexTypeInfo*& typeInfo,
                                              DatatypeValidator*& validator,
                                              const XMLCh* const subsElemQName)
{
    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    SchemaElementDecl* subsElemDecl = getGlobalElemDecl(elem, subsElemQName);
    if (subsElemDecl)
    {
        if (isSubstitutionGroupCircular(elemDecl, subsElemDecl))
        {
            reportSchemaError(
                elem , XMLUni::fgXMLErrDomain , XMLErrs::CircularSubsGroup, elemDecl->getBaseName());
        }
        else
        {
            // Check for substitution validity constraint
            // Substitution allowed (block and blockDefault) && same type
            if (isSubstitutionGroupValid(elem, subsElemDecl, typeInfo, validator, elemDecl->getBaseName()))
            {
                elemDecl->setSubstitutionGroupElem(subsElemDecl);

                // if type information is missing, use subsGroup one
                if (!typeInfo && !validator)
                {
                    typeInfo = subsElemDecl->getComplexTypeInfo();
                    validator = subsElemDecl->getDatatypeValidator();

                    if (validator)
                    {
                        elemDecl->setDatatypeValidator(validator);
                        elemDecl->setModelType(SchemaElementDecl::Simple);
                    }
                    else if (typeInfo)
                    {
                        elemDecl->setComplexTypeInfo(typeInfo);
                        elemDecl->setModelType((SchemaElementDecl::ModelTypes)typeInfo->getContentType());
                    }
                }

                XMLCh* subsElemBaseName = subsElemDecl->getBaseName();
                int    subsElemURI = subsElemDecl->getURI();
                ValueVectorOf<SchemaElementDecl*>* subsElements =
                    fValidSubstitutionGroups->get(subsElemBaseName, subsElemURI);

                if (!subsElements && fTargetNSURI != subsElemURI)
                {
                    SchemaGrammar* aGrammar = (SchemaGrammar*) fGrammarResolver->getGrammar(fURIStringPool->getValueForId(subsElemURI));

                    if (aGrammar)
                    {
                        subsElements = aGrammar->getValidSubstitutionGroups()->get(subsElemBaseName, subsElemURI);

                        if (subsElements)
                        {
                            subsElements = new (fGrammarPoolMemoryManager) ValueVectorOf<SchemaElementDecl*>(*subsElements);
                            fValidSubstitutionGroups->put(subsElemBaseName, subsElemURI, subsElements);
                        }
                        else if (fSchemaInfo->circularImportExist(subsElemURI))
                        {
                            aGrammar->getValidSubstitutionGroups()->put(
                            subsElemBaseName, subsElemURI, new (fGrammarPoolMemoryManager) ValueVectorOf<SchemaElementDecl*>(8, fGrammarPoolMemoryManager));
                        }
                    }
                }

                if (!subsElements)
                {
                    subsElements = new (fGrammarPoolMemoryManager) ValueVectorOf<SchemaElementDecl*>(8, fGrammarPoolMemoryManager);
                    fValidSubstitutionGroups->put(subsElemBaseName, subsElemURI, subsElements);
                }

                subsElements->addElement(elemDecl);

                // update related subs. info in case of circular import
                BaseRefVectorEnumerator<SchemaInfo> importingEnum = fSchemaInfo->getImportingListEnumerator();

                while (importingEnum.hasMoreElements())
                {
                    const SchemaInfo& curRef = importingEnum.nextElement();
                    SchemaGrammar* aGrammar = (SchemaGrammar*) fGrammarResolver->getGrammar(curRef.getTargetNSURIString());
                    ValueVectorOf<SchemaElementDecl*>* subsElemList =
                        aGrammar->getValidSubstitutionGroups()->get(subsElemBaseName, subsElemURI);

                    if (subsElemList && !subsElemList->containsElement(elemDecl))
                        subsElemList->addElement(elemDecl);
                }

                buildValidSubstitutionListB(elem, elemDecl, subsElemDecl);
                buildValidSubstitutionListF(elem, elemDecl, subsElemDecl);
            }
        }
    }
}